

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

void Console::SetTextColor(Stream stream,Color color,bool bold)

{
  char *pcVar1;
  undefined8 *puVar2;
  undefined7 in_register_00000011;
  char local_8 [8];
  
  builtin_strncpy(local_8,"\x1b[1;30m",8);
  if ((int)CONCAT71(in_register_00000011,bold) == 0) {
    pcVar1 = local_8 + 3;
    builtin_strncpy(local_8,"\x1b[30m",6);
    local_8[6] = 'm';
    local_8[7] = '\0';
  }
  else {
    pcVar1 = local_8 + 5;
  }
  *pcVar1 = *pcVar1 + ansi_color_map[(long)(int)color * 4];
  if (stream == STREAM_OUT) {
    puVar2 = (undefined8 *)&stdout;
  }
  else {
    puVar2 = (undefined8 *)&stderr;
  }
  fputs(local_8,(FILE *)*puVar2);
  return;
}

Assistant:

void SetTextColor(Stream stream, Color color, bool bold)
{
	char command[8] = {27, '[', '1', ';', '3', '0', 'm', 0};

	if (bold)
	{
		command[5] += ansi_color_map[static_cast<int>(color)];
	}
	else
	{
		for (int i = 2; i < 6; ++i)
			command[i] = command[i + 2];

		command[3] += ansi_color_map[static_cast<int>(color)];
	}

	std::fputs(command, (stream == STREAM_OUT) ? stdout : stderr);
}